

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O2

bool __thiscall FDrawInfo::DoOneSectorLower(FDrawInfo *this,subsector_t *subsec,float Planez)

{
  long *plVar1;
  double dVar2;
  uint uVar3;
  seg_t *psVar4;
  subsector_t *subsec_00;
  bool bVar5;
  ulong uVar6;
  sector_t *psVar7;
  long lVar8;
  DWORD i;
  ulong uVar9;
  subsector_t *subsec_local;
  
  uVar6 = (ulong)subsec->numlines;
  lVar8 = 0;
  while (uVar6 * 0x48 + 0x48 != lVar8 + 0x48) {
    if ((*(long *)((long)&subsec->firstline->backsector + lVar8) == 0) ||
       (plVar1 = (long *)((long)&subsec->firstline->PartnerSeg + lVar8), lVar8 = lVar8 + 0x48,
       *plVar1 == 0)) {
      return false;
    }
  }
  lVar8 = 0x30;
  uVar9 = 0;
  subsec_local = subsec;
  do {
    if (uVar6 <= uVar9) {
      TArray<subsector_t_*,_subsector_t_*>::Push(&this->HandledSubsectors,&subsec_local);
      return true;
    }
    psVar4 = subsec->firstline;
    subsec_00 = *(subsector_t **)(*(long *)((long)&psVar4->v1 + lVar8) + 0x38);
    if (subsec_00->validcount != validcount) {
      subsec_00->validcount = validcount;
      psVar7 = *(sector_t **)((long)psVar4 + lVar8 + -8);
      if ((*(sector_t **)((long)psVar4 + lVar8 + -0x10) != psVar7) &&
         (*(long *)((long)psVar4 + lVar8 + -0x18) != 0)) {
        psVar7 = gl_FakeFlat(psVar7,&fakesec,true);
        if ((psVar7->floorplane).normal.Y != 0.0 || (psVar7->floorplane).normal.X != 0.0) {
          return false;
        }
        dVar2 = psVar7->planes[0].TexZ;
        if ((double)Planez < dVar2) {
          return false;
        }
        if (dVar2 == (double)Planez) {
          uVar3 = *(uint *)(*(long *)((long)psVar4 + lVar8 + -0x20) + 0x90);
          if (((uVar3 < TexMan.Textures.Count) &&
              (TexMan.Textures.Array[(int)uVar3].Texture != (FTexture *)0x0)) &&
             ((TexMan.Textures.Array[(int)uVar3].Texture)->UseType != '\r')) {
            return false;
          }
          goto LAB_003f4e32;
        }
      }
      bVar5 = DoOneSectorLower(this,subsec_00,Planez);
      if (!bVar5) {
        return false;
      }
    }
LAB_003f4e32:
    uVar9 = uVar9 + 1;
    uVar6 = (ulong)subsec->numlines;
    lVar8 = lVar8 + 0x48;
  } while( true );
}

Assistant:

bool FDrawInfo::DoOneSectorLower(subsector_t * subsec, float Planez)
{
	// Is there a one-sided wall in this subsector?
	// Do this first to avoid unnecessary recursion
	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		if (subsec->firstline[i].backsector == NULL) return false;
		if (subsec->firstline[i].PartnerSeg == NULL) return false;
	}

	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		seg_t * seg = subsec->firstline + i;
		subsector_t * backsub = seg->PartnerSeg->Subsector;

		// already checked?
		if (backsub->validcount == validcount) continue;
		backsub->validcount = validcount;

		if (seg->frontsector != seg->backsector && seg->linedef)
		{
			// Note: if this is a real line between sectors
			// we can be sure that render_sector is the real sector!

			sector_t * sec = gl_FakeFlat(seg->backsector, &fakesec, true);

			// Don't bother with slopes
			if (sec->floorplane.isSlope())  return false;

			// Is the neighboring floor higher than the desired height?
			if (sec->GetPlaneTexZ(sector_t::floor) > Planez)
			{
				// todo: check for missing textures.
				return false;
			}

			// This is an exact height match which means we don't have to do any further checks for this sector
			if (sec->GetPlaneTexZ(sector_t::floor) == Planez)
			{
				// If there's a texture abort
				FTexture * tex = TexMan[seg->sidedef->GetTexture(side_t::bottom)];
				if (!tex || tex->UseType == FTexture::TEX_Null) continue;
				else return false;
			}
		}
		if (!DoOneSectorLower(backsub, Planez)) return false;
	}
	// all checked ok. This sector is part of the current fake plane

	HandledSubsectors.Push(subsec);
	return 1;
}